

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

void __thiscall
mocker::anon_unknown_5::FindPureFunctions::operator()(FindPureFunctions *this,IfStmt *node)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  
  peVar1 = (node->condition).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var2 = (node->condition).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (*(peVar1->super_ASTNode)._vptr_ASTNode[3])(peVar1,this);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  peVar3 = (node->then).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (node->then).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (*(peVar3->super_ASTNode)._vptr_ASTNode[3])(peVar3,this);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  peVar3 = (node->else_).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar3 != (element_type *)0x0) {
    p_Var2 = (node->else_).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*(peVar3->super_ASTNode)._vptr_ASTNode[3])(peVar3,this);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      return;
    }
  }
  return;
}

Assistant:

void operator()(const ast::IfStmt &node) const override {
    visit(node.condition);
    visit(node.then);
    if (node.else_)
      visit(node.else_);
  }